

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_srtp.cc
# Opt level: O1

int ssl_ctx_make_profiles
              (char *profiles_string,UniquePtr<struct_stack_st_SRTP_PROTECTION_PROFILE> *out)

{
  bool bVar1;
  _Head_base<0UL,_stack_st_SRTP_PROTECTION_PROFILE_*,_false> __p;
  __uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *p_Var2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  size_t __n;
  SRTP_PROTECTION_PROFILE *p;
  SRTP_PROTECTION_PROFILE *p_00;
  SRTP_PROTECTION_PROFILE *unaff_R15;
  SRTP_PROTECTION_PROFILE *profile;
  UniquePtr<struct_stack_st_SRTP_PROTECTION_PROFILE> profiles;
  _Head_base<0UL,_stack_st_SRTP_PROTECTION_PROFILE_*,_false> local_40;
  __uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *local_38;
  
  local_40._M_head_impl = (stack_st_SRTP_PROTECTION_PROFILE *)OPENSSL_sk_new_null();
  p_Var2 = (__uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *)out;
  if ((OPENSSL_STACK *)local_40._M_head_impl == (OPENSSL_STACK *)0x0) {
    iVar3 = 0;
    ERR_put_error(0x10,0,0xd3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                  ,0x3d);
  }
  else {
    do {
      local_38 = p_Var2;
      pcVar4 = strchr(profiles_string,0x3a);
      if (pcVar4 == (char *)0x0) {
        __n = strlen(profiles_string);
      }
      else {
        __n = (long)pcVar4 - (long)profiles_string;
      }
      __s = "SRTP_AES128_CM_SHA1_80";
      p_00 = kSRTPProfiles;
      do {
        sVar5 = strlen(__s);
        if ((sVar5 == __n) && (iVar3 = strncmp(__s,profiles_string,__n), iVar3 == 0)) {
          bVar1 = false;
          goto LAB_0027bdeb;
        }
        __s = p_00[1].name;
        p_00 = p_00 + 1;
      } while (__s != (char *)0x0);
      bVar1 = true;
      p_00 = unaff_R15;
LAB_0027bdeb:
      if (bVar1) {
        bVar1 = false;
        ERR_put_error(0x10,0,0xd4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                      ,0x49);
      }
      else {
        sVar6 = OPENSSL_sk_push((OPENSSL_STACK *)local_40._M_head_impl,p_00);
        if (sVar6 == 0) {
          bVar1 = false;
        }
        else {
          if (pcVar4 != (char *)0x0) {
            profiles_string = pcVar4 + 1;
          }
          bVar1 = true;
        }
      }
      __p._M_head_impl = local_40._M_head_impl;
      if (!bVar1) {
        iVar3 = 0;
        goto LAB_0027be84;
      }
      unaff_R15 = p_00;
      p_Var2 = local_38;
    } while (pcVar4 != (char *)0x0);
    local_40._M_head_impl = (stack_st_SRTP_PROTECTION_PROFILE *)0x0;
    std::__uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::reset
              (local_38,__p._M_head_impl);
    iVar3 = 1;
  }
LAB_0027be84:
  std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *)&local_40);
  return iVar3;
}

Assistant:

static int ssl_ctx_make_profiles(
    const char *profiles_string,
    UniquePtr<STACK_OF(SRTP_PROTECTION_PROFILE)> *out) {
  UniquePtr<STACK_OF(SRTP_PROTECTION_PROFILE)> profiles(
      sk_SRTP_PROTECTION_PROFILE_new_null());
  if (profiles == nullptr) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SRTP_COULD_NOT_ALLOCATE_PROFILES);
    return 0;
  }

  const char *col;
  const char *ptr = profiles_string;
  do {
    col = strchr(ptr, ':');

    const SRTP_PROTECTION_PROFILE *profile;
    if (!find_profile_by_name(ptr, &profile,
                              col ? (size_t)(col - ptr) : strlen(ptr))) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_SRTP_UNKNOWN_PROTECTION_PROFILE);
      return 0;
    }

    if (!sk_SRTP_PROTECTION_PROFILE_push(profiles.get(), profile)) {
      return 0;
    }

    if (col) {
      ptr = col + 1;
    }
  } while (col);

  *out = std::move(profiles);
  return 1;
}